

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O2

void chapter3::query_map(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *families,string *query_name)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  ostream *poVar3;
  const_iterator viter;
  _Base_ptr p_Var4;
  const_iterator vend_iter;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&families->_M_t,query_name);
  if ((_Rb_tree_header *)cVar2._M_node == &(families->_M_t)._M_impl.super__Rb_tree_header) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Sorry, the ");
    poVar3 = std::operator<<(poVar3,(string *)query_name);
    poVar3 = std::operator<<(poVar3," is not currently entered.");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"The ");
    std::operator<<(poVar3,(string *)query_name);
    p_Var4 = *(_Base_ptr *)(cVar2._M_node + 2);
    p_Var1 = cVar2._M_node[2]._M_parent;
    if (p_Var1 == p_Var4) {
      std::operator<<((ostream *)&std::cout," has no children.\n");
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cout," has ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," children: ");
    for (; p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)p_Var4);
      std::operator<<(poVar3," ");
    }
    poVar3 = (ostream *)&std::cout;
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void chapter3::query_map(const map<string, vector<string>> &families, const string query_name) {
    map<string, vector<string>>::const_iterator it = families.find(query_name);

    if (it == families.end()) {
        cout << "Sorry, the " << query_name
             << " is not currently entered." << endl;
        return;
    }

    cout << "The " << query_name;
    if (!it->second.size()) {
        cout << " has no children.\n";
    } else {
        vector<string>::const_iterator viter = it->second.begin(), vend_iter = it->second.end();

        cout << " has " << it->second.size() << " children: ";
        while (viter != vend_iter) {
            cout << *viter << " ";
            ++viter;
        }
        cout << endl;
    }
}